

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_tree.hpp
# Opt level: O0

void tao::pegtl::parse_tree::internal::make_control<queryparse::store,tao::pegtl::normal>::
     control<queryparse::index,true>::
     success<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,tao::pegtl::parse_tree::node>
               (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,state<tao::pegtl::parse_tree::node> *state)

{
  bool bVar1;
  type n;
  string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb8;
  default_node_content *in_stack_ffffffffffffffc0;
  unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  local_18 [3];
  
  state<tao::pegtl::parse_tree::node>::back((state<tao::pegtl::parse_tree::node> *)0x24b1d8);
  std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  ::unique_ptr((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                *)in_stack_ffffffffffffffc0,
               (unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                *)in_stack_ffffffffffffffb8);
  state<tao::pegtl::parse_tree::node>::pop_back((state<tao::pegtl::parse_tree::node> *)0x24b1ef);
  std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  ::operator->((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                *)0x24b1f9);
  default_node_content::
  success<queryparse::index,tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  transform<tao::pegtl::parse_tree::node,_queryparse::store<queryparse::index>,_void>::call<>
            (local_18);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                      *)0x24b21e);
  if (bVar1) {
    state<tao::pegtl::parse_tree::node>::back((state<tao::pegtl::parse_tree::node> *)0x24b22e);
    in_stack_ffffffffffffffc0 =
         (default_node_content *)
         std::
         unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
         ::operator->((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                       *)0x24b236);
    std::
    unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>::
    unique_ptr((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                *)in_stack_ffffffffffffffc0,
               (unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                *)in_stack_ffffffffffffffb8);
    default_node_children<tao::pegtl::parse_tree::node>::emplace_back<>
              ((default_node_children<tao::pegtl::parse_tree::node> *)in_stack_ffffffffffffffc0,
               (unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                *)in_stack_ffffffffffffffb8);
    std::
    unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>::
    ~unique_ptr((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                 *)in_stack_ffffffffffffffc0);
  }
  std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  ::~unique_ptr((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                 *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

static void success( const Input& in, state< Node >& state, States&&... st )
               {
                  auto n = std::move( state.back() );
                  state.pop_back();
                  n->template success< Rule >( in, st... );
                  transform< Node, S< Rule > >::call( n, st... );
                  if( n ) {
                     state.back()->emplace_back( std::move( n ), st... );
                  }
               }